

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

opj_image_t * pnmtoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  byte bVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  undefined4 uVar6;
  byte local_129;
  uint local_128;
  int iStack_124;
  uchar uc_1;
  int uc;
  int bit;
  int y;
  int x;
  uint index_1;
  undefined1 uStack_10c;
  uchar one;
  uchar c1;
  uchar c0;
  uint index;
  pnm_header header_info;
  opj_image_t *image;
  opj_image_cmptparm_t cmptparm [4];
  undefined4 local_50;
  OPJ_COLOR_SPACE color_space;
  int format;
  int prec;
  int h;
  int w;
  int numcomps;
  int compno;
  int i;
  FILE *fp;
  int subsampling_dy;
  int subsampling_dx;
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  header_info.rgb = '\0';
  header_info.rgba = '\0';
  header_info.gray = '\0';
  header_info.graya = '\0';
  header_info.bw = '\0';
  header_info.ok = '\0';
  header_info._26_2_ = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pnmtoimage:Failed to open %s for reading!\n",filename);
    filename_local = (char *)0x0;
  }
  else {
    memset(&uStack_10c,0,0x1c);
    read_pnm_header((FILE *)__stream,(pnm_header *)&uStack_10c);
    if (header_info.format._1_1_ == '\0') {
      fclose(__stream);
      filename_local = (char *)0x0;
    }
    else if (((_uStack_10c == 0) || (index == 0)) ||
            ((header_info.maxval == 7 && (header_info.height == 0)))) {
      fclose(__stream);
      filename_local = (char *)0x0;
    }
    else if ((index == 0) || ((int)_uStack_10c <= (int)(0x7fffffff / (long)(int)index))) {
      switch(header_info.maxval) {
      case 1:
      case 4:
        h = 1;
        break;
      case 2:
      case 5:
        h = 1;
        break;
      case 3:
      case 6:
        h = 3;
        break;
      case 7:
        h = header_info.height;
        break;
      default:
        fclose(__stream);
        return (opj_image_t *)0x0;
      }
      if (h < 3) {
        local_50 = 2;
      }
      else {
        local_50 = 1;
      }
      color_space = has_prec(header_info.width);
      if (color_space < 8) {
        color_space = 8;
      }
      OVar1 = parameters->subsampling_dx;
      OVar2 = parameters->subsampling_dy;
      memset(&image,0,(long)h * 0x24);
      for (numcomps = 0; numcomps < h; numcomps = numcomps + 1) {
        cmptparm[numcomps].x0 = color_space;
        cmptparm[numcomps].y0 = color_space;
        cmptparm[numcomps].prec = 0;
        cmptparm[(long)numcomps + -1].bpp = OVar1;
        cmptparm[(long)numcomps + -1].sgnd = OVar2;
        cmptparm[numcomps].dx = _uStack_10c;
        cmptparm[numcomps].dy = index;
      }
      header_info._20_8_ = opj_image_create(h,&image,local_50);
      if ((int *)header_info._20_8_ == (int *)0x0) {
        fclose(__stream);
        filename_local = (char *)0x0;
      }
      else {
        *(int *)header_info._20_8_ = parameters->image_offset_x0;
        *(int *)(header_info._20_8_ + 4) = parameters->image_offset_y0;
        *(uint *)(header_info._20_8_ + 8) =
             parameters->image_offset_x0 + (_uStack_10c - 1) * OVar1 + 1;
        *(uint *)(header_info._20_8_ + 0xc) = parameters->image_offset_y0 + (index - 1) * OVar2 + 1;
        if ((header_info.maxval == 2) || (header_info.maxval == 3)) {
          for (numcomps = 0; numcomps < (int)(_uStack_10c * index); numcomps = numcomps + 1) {
            for (w = 0; w < h; w = w + 1) {
              index_1 = 0;
              iVar4 = __isoc99_fscanf(__stream,"%u",&index_1);
              if (iVar4 != 1) {
                fprintf(_stderr,"Missing data. Quitting.\n");
                opj_image_destroy(header_info._20_8_);
                fclose(__stream);
                return (opj_image_t *)0x0;
              }
              *(int *)(*(long *)(*(long *)(header_info._20_8_ + 0x18) + (long)w * 0x40 + 0x30) +
                      (long)numcomps * 4) = (int)(index_1 * 0xff) / header_info.width;
            }
          }
        }
        else if (((header_info.maxval == 5) || (header_info.maxval == 6)) ||
                ((header_info.maxval == 7 &&
                 ((((header_info.depth._2_1_ != '\0' || (header_info.depth._3_1_ != '\0')) ||
                   ((char)header_info.depth != '\0')) || (header_info.depth._1_1_ != '\0')))))) {
          x._1_1_ = color_space < 9;
          for (numcomps = 0; numcomps < (int)(_uStack_10c * index); numcomps = numcomps + 1) {
            for (w = 0; w < h; w = w + 1) {
              sVar5 = fread((void *)((long)&x + 3),1,1,__stream);
              if (sVar5 == 0) {
                fprintf(_stderr,"Missing data. Quitting.\n");
                opj_image_destroy(header_info._20_8_);
                fclose(__stream);
                return (opj_image_t *)0x0;
              }
              if (x._1_1_ == '\0') {
                sVar5 = fread((void *)((long)&x + 2),1,1,__stream);
                if (sVar5 == 0) {
                  fprintf(_stderr,"Missing data. Quitting.\n");
                  opj_image_destroy(header_info._20_8_);
                  fclose(__stream);
                  return (opj_image_t *)0x0;
                }
                *(uint *)(*(long *)(*(long *)(header_info._20_8_ + 0x18) + (long)w * 0x40 + 0x30) +
                         (long)numcomps * 4) = (uint)x._2_2_;
              }
              else {
                *(uint *)(*(long *)(*(long *)(header_info._20_8_ + 0x18) + (long)w * 0x40 + 0x30) +
                         (long)numcomps * 4) = (uint)x._3_1_;
              }
            }
          }
        }
        else if (header_info.maxval == 1) {
          for (numcomps = 0; numcomps < (int)(_uStack_10c * index); numcomps = numcomps + 1) {
            iVar4 = __isoc99_fscanf(__stream,"%u",&y);
            if (iVar4 != 1) {
              fprintf(_stderr,"Missing data. Quitting.\n");
              opj_image_destroy(header_info._20_8_);
              fclose(__stream);
              return (opj_image_t *)0x0;
            }
            uVar6 = 0xff;
            if (y != 0) {
              uVar6 = 0;
            }
            *(undefined4 *)
             (*(long *)(*(long *)(header_info._20_8_ + 0x18) + 0x30) + (long)numcomps * 4) = uVar6;
          }
        }
        else if (header_info.maxval == 4) {
          numcomps = 0;
          for (uc = 0; uc < (int)index; uc = uc + 1) {
            iStack_124 = -1;
            local_128 = 0;
            for (bit = 0; bit < (int)_uStack_10c; bit = bit + 1) {
              if (iStack_124 == -1) {
                iStack_124 = 7;
                local_128 = getc(__stream);
                if (local_128 == 0xffffffff) {
                  fprintf(_stderr,"Missing data. Quitting.\n");
                  opj_image_destroy(header_info._20_8_);
                  fclose(__stream);
                  return (opj_image_t *)0x0;
                }
              }
              bVar3 = (byte)iStack_124 & 0x1f;
              iVar4 = 0xff;
              if (((int)(local_128 & 0xff) >> bVar3 & 1U) != 0) {
                iVar4 = 0 >> bVar3;
              }
              *(int *)(*(long *)(*(long *)(header_info._20_8_ + 0x18) + 0x30) + (long)numcomps * 4)
                   = iVar4;
              iStack_124 = iStack_124 + -1;
              numcomps = numcomps + 1;
            }
          }
        }
        else if ((header_info.maxval == 7) && ((char)header_info.format != '\0')) {
          for (numcomps = 0; numcomps < (int)(_uStack_10c * index); numcomps = numcomps + 1) {
            sVar5 = fread(&local_129,1,1,__stream);
            if (sVar5 == 0) {
              fprintf(_stderr,"Missing data. Quitting.\n");
              opj_image_destroy(header_info._20_8_);
              fclose(__stream);
              return (opj_image_t *)0x0;
            }
            uVar6 = 0xff;
            if ((local_129 & 1) != 0) {
              uVar6 = 0;
            }
            *(undefined4 *)
             (*(long *)(*(long *)(header_info._20_8_ + 0x18) + 0x30) + (long)numcomps * 4) = uVar6;
          }
        }
        fclose(__stream);
        filename_local = (char *)header_info._20_8_;
      }
    }
    else {
      fprintf(_stderr,"pnmtoimage:Image %dx%d too big!\n",(ulong)_uStack_10c,(ulong)index);
      fclose(__stream);
      filename_local = (char *)0x0;
    }
  }
  return (opj_image_t *)filename_local;
}

Assistant:

opj_image_t* pnmtoimage(const char *filename, opj_cparameters_t *parameters)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *fp = NULL;
    int i, compno, numcomps, w, h, prec, format;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm[4]; /* RGBA: max. 4 components */
    opj_image_t * image = NULL;
    struct pnm_header header_info;

    if ((fp = fopen(filename, "rb")) == NULL) {
        fprintf(stderr, "pnmtoimage:Failed to open %s for reading!\n", filename);
        return NULL;
    }
    memset(&header_info, 0, sizeof(struct pnm_header));

    read_pnm_header(fp, &header_info);

    if (!header_info.ok) {
        fclose(fp);
        return NULL;
    }

    if (header_info.width == 0
            || header_info.height == 0
            || (header_info.format == 7 && header_info.depth == 0)) {
        fclose(fp);
        return NULL;
    }

    /* This limitation could be removed by making sure to use size_t below */
    if (header_info.height != 0 &&
            header_info.width > INT_MAX / header_info.height) {
        fprintf(stderr, "pnmtoimage:Image %dx%d too big!\n",
                header_info.width, header_info.height);
        fclose(fp);
        return NULL;
    }

    format = header_info.format;

    switch (format) {
    case 1: /* ascii bitmap */
    case 4: /* raw bitmap */
        numcomps = 1;
        break;

    case 2: /* ascii greymap */
    case 5: /* raw greymap */
        numcomps = 1;
        break;

    case 3: /* ascii pixmap */
    case 6: /* raw pixmap */
        numcomps = 3;
        break;

    case 7: /* arbitrary map */
        numcomps = header_info.depth;
        break;

    default:
        fclose(fp);
        return NULL;
    }
    if (numcomps < 3) {
        color_space = OPJ_CLRSPC_GRAY;    /* GRAY, GRAYA */
    } else {
        color_space = OPJ_CLRSPC_SRGB;    /* RGB, RGBA */
    }

    prec = has_prec(header_info.maxval);

    if (prec < 8) {
        prec = 8;
    }

    w = header_info.width;
    h = header_info.height;
    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    memset(&cmptparm[0], 0, (size_t)numcomps * sizeof(opj_image_cmptparm_t));

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)prec;
        cmptparm[i].bpp = (OPJ_UINT32)prec;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(fp);
        return NULL;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)(parameters->image_offset_x0 + (w - 1) * subsampling_dx
                             + 1);
    image->y1 = (OPJ_UINT32)(parameters->image_offset_y0 + (h - 1) * subsampling_dy
                             + 1);

    if ((format == 2) || (format == 3)) { /* ascii pixmap */
        unsigned int index;

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                index = 0;
                if (fscanf(fp, "%u", &index) != 1) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }

                image->comps[compno].data[i] = (OPJ_INT32)(index * 255) / header_info.maxval;
            }
        }
    } else if ((format == 5)
               || (format == 6)
               || ((format == 7)
                   && (header_info.gray || header_info.graya
                       || header_info.rgb || header_info.rgba))) { /* binary pixmap */
        unsigned char c0, c1, one;

        one = (prec < 9);

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                if (!fread(&c0, 1, 1, fp)) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }
                if (one) {
                    image->comps[compno].data[i] = c0;
                } else {
                    if (!fread(&c1, 1, 1, fp)) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                    /* netpbm: */
                    image->comps[compno].data[i] = ((c0 << 8) | c1);
                }
            }
        }
    } else if (format == 1) { /* ascii bitmap */
        for (i = 0; i < w * h; i++) {
            unsigned int index;

            if (fscanf(fp, "%u", &index) != 1) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }

            image->comps[0].data[i] = (index ? 0 : 255);
        }
    } else if (format == 4) {
        int x, y, bit;
        int uc;

        i = 0;
        for (y = 0; y < h; ++y) {
            bit = -1;
            uc = 0;

            for (x = 0; x < w; ++x) {
                if (bit == -1) {
                    bit = 7;
                    uc = getc(fp);
                    if (uc == EOF) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                }
                image->comps[0].data[i] = ((((unsigned char)uc >> bit) & 1) ? 0 : 255);
                --bit;
                ++i;
            }
        }
    } else if ((format == 7 && header_info.bw)) { /*MONO*/
        unsigned char uc;

        for (i = 0; i < w * h; ++i) {
            if (!fread(&uc, 1, 1, fp)) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }
            image->comps[0].data[i] = (uc & 1) ? 0 : 255;
        }
    }
    fclose(fp);

    return image;
}